

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_acquire(command *cmd)

{
  loc grid;
  _Bool _Var1;
  wchar_t wVar2;
  char *prompt;
  wchar_t great;
  wchar_t n;
  wchar_t local_10;
  wchar_t local_c;
  
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_10);
  if (wVar2 != L'\0') {
    _Var1 = get_check("Acquire great objects? ");
    local_10 = (wchar_t)_Var1;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_10);
  }
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_c);
  if (wVar2 != L'\0') {
    prompt = "How many great objects? ";
    if (local_10 == L'\0') {
      prompt = "How many good objects? ";
    }
    local_c = get_quantity(prompt,L'(');
    if (local_c < L'\x01') {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"quantity",local_c);
  }
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  acquirement(grid,(int)player->depth,local_c,local_10 != L'\0');
  return;
}

Assistant:

void do_cmd_wiz_acquire(struct command *cmd)
{
	int n, great;

	if (cmd_get_arg_choice(cmd, "choice", &great) != CMD_OK) {
		great = (get_check("Acquire great objects? ")) ? 1 : 0;
		cmd_set_arg_choice(cmd, "choice", great);
	}

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity((great) ?
			"How many great objects? " : "How many good objects? ",
			40);
		if (n < 1) return;
		cmd_set_arg_number(cmd, "quantity", n);
	}

	acquirement(player->grid, player->depth, n, great);
}